

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Token __thiscall slang::parsing::Parser::parseSigning(Parser *this)

{
  Token TVar1;
  Token local_18;
  
  TVar1 = ParserBase::peek(&this->super_ParserBase);
  if ((TVar1.kind == UnsignedKeyword) || (TVar1.kind == SignedKeyword)) {
    local_18 = ParserBase::consume(&this->super_ParserBase);
  }
  else {
    Token::Token(&local_18);
  }
  return local_18;
}

Assistant:

Token Parser::parseSigning() {
    switch (peek().kind) {
        case TokenKind::SignedKeyword:
        case TokenKind::UnsignedKeyword:
            return consume();
        default:
            return Token();
    }
}